

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstExpr.cpp
# Opt level: O2

longlong TestConstExpr::ConstConstructor<long_long>(void)

{
  SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> SVar1;
  SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> local_18;
  SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> local_10;
  SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> local_8;
  
  local_18.m_int = 0;
  local_10 = SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator+
                       (&local_18,
                        (SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter>)
                        0x1);
  local_8 = SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator+
                      (&local_10,
                       (SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter>)0x0
                      );
  SVar1 = SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator+
                    (&local_8,(SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter>
                               )0x3);
  return SVar1.m_int;
}

Assistant:

SAFEINT_CONSTEXPR11 T ConstConstructor()
	{
		// Constructors, also add in the useless unary + operator
		return SafeInt<T>() + SafeInt<T>(1) + SafeInt<T>(false) + (+SafeInt<T>(3));
	}